

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O1

uint32_t helper_vfp_fcvt_f32_to_f16_arm(float32 a,void *fpstp,uint32_t ahp_mode)

{
  undefined1 uVar1;
  float16 fVar2;
  
  uVar1 = *(undefined1 *)((long)fpstp + 4);
  *(undefined1 *)((long)fpstp + 4) = 0;
  fVar2 = float32_to_float16_arm(a,ahp_mode == 0,(float_status *)fpstp);
  *(undefined1 *)((long)fpstp + 4) = uVar1;
  return (uint32_t)fVar2;
}

Assistant:

uint32_t HELPER(vfp_fcvt_f32_to_f16)(float32 a, void *fpstp, uint32_t ahp_mode)
{
    /* Squash FZ16 to 0 for the duration of conversion.  In this case,
     * it would affect flushing output denormals.
     */
    float_status *fpst = fpstp;
    flag save = get_flush_to_zero(fpst);
    set_flush_to_zero(false, fpst);
    float16 r = float32_to_float16(a, !ahp_mode, fpst);
    set_flush_to_zero(save, fpst);
    return r;
}